

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

iterator __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>::
insert<std::reverse_iterator<pbrt::ParsedParameter*const*>>
          (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
           *this,const_iterator pos,reverse_iterator<pbrt::ParsedParameter_*const_*> *first,
          reverse_iterator<pbrt::ParsedParameter_*const_*> *last)

{
  bool bVar1;
  iterator ppPVar2;
  reference args;
  long lVar3;
  size_t in_RCX;
  reverse_iterator<pbrt::ParsedParameter_*const_*> *in_RDX;
  iterator in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  reverse_iterator<pbrt::ParsedParameter_*const_*> iter;
  iterator pos_1;
  reverse_iterator<pbrt::ParsedParameter_*const_*> *in_stack_ffffffffffffff98;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffffa0;
  reverse_iterator<pbrt::ParsedParameter_*const_*> local_30;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_28;
  
  ppPVar2 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            ::end(in_stack_ffffffffffffffa0);
  if (in_RSI == ppPVar2) {
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::size(in_RDI);
    std::operator-((reverse_iterator<pbrt::ParsedParameter_*const_*> *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::reserve(in_RDI,in_RCX);
    local_28 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  ::end(in_stack_ffffffffffffffa0);
    std::reverse_iterator<pbrt::ParsedParameter_*const_*>::reverse_iterator(&local_30,in_RDX);
    while( true ) {
      bVar1 = std::operator!=((reverse_iterator<pbrt::ParsedParameter_*const_*> *)
                              in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (!bVar1) break;
      in_stack_ffffffffffffffa0 = local_28;
      args = std::reverse_iterator<pbrt::ParsedParameter_*const_*>::operator*(&local_30);
      pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
      construct<pbrt::ParsedParameter*,pbrt::ParsedParameter*const&>
                ((polymorphic_allocator<pbrt::ParsedParameter*> *)in_RDI,
                 (ParsedParameter **)in_stack_ffffffffffffffa0,args);
      std::reverse_iterator<pbrt::ParsedParameter_*const_*>::operator++(&local_30);
      local_28 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  *)&local_28->ptr;
    }
    lVar3 = std::operator-((reverse_iterator<pbrt::ParsedParameter_*const_*> *)
                           in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    in_RDI->nStored = lVar3 + in_RDI->nStored;
    return (iterator)local_28;
  }
  LogFatal(this._4_4_,(char *)pos,first._4_4_,(char *)last);
}

Assistant:

iterator insert(const_iterator pos, InputIt first, InputIt last) {
        if (pos == end()) {
            reserve(size() + (last - first));
            iterator pos = end();
            for (auto iter = first; iter != last; ++iter, ++pos)
                alloc.template construct<T>(pos, *iter);
            nStored += last - first;
            return pos;
        } else {
            // TODO
            LOG_FATAL("TODO");
        }
    }